

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_string *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  size_type *psVar1;
  size_type *psVar2;
  long lVar3;
  _Alloc_hider _Var4;
  string *psVar5;
  size_type sVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  uint32_t uVar10;
  ostream *poVar11;
  long *plVar12;
  long *plVar13;
  const_iterator cVar14;
  mapped_type *pmVar15;
  void *pvVar16;
  Property *args;
  size_type __n;
  _Base_ptr __k;
  Property *prop;
  Property *args_2;
  pointer pcVar17;
  bool bVar18;
  ParseResult ret_1;
  ParseResult sret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ParseResult ret;
  ostringstream ss_e;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa08;
  _Base_ptr local_5e8;
  undefined1 local_5e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5c8;
  string local_5b8;
  ParseResult local_598;
  string *local_570;
  Property *local_568;
  key_type local_560;
  AttrMetas *local_540;
  UsdPrimvarReader_string *local_538;
  string *local_530;
  Property *local_528;
  _Base_ptr local_520;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_518;
  string *local_4e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_4e0;
  Property *local_4d8;
  _Base_ptr local_4d0;
  long *local_4c8;
  ulong local_4c0;
  long local_4b8 [2];
  long *local_4a8 [2];
  long local_498 [2];
  string local_488;
  key_type local_468;
  long *local_448 [2];
  long local_438 [2];
  undefined1 local_428 [8];
  _Alloc_hider local_420;
  undefined1 local_418 [96];
  ios_base local_3b8 [264];
  undefined1 local_2b0 [72];
  storage_union asStack_268 [2];
  undefined8 local_248;
  pointer pSStack_240;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  bool local_218;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  undefined1 local_1f0 [48];
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_1c0;
  pointer local_188;
  storage_t<double> sStack_180;
  undefined1 local_178 [144];
  undefined4 local_e8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined8 local_d0;
  size_type local_c8;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_c0;
  undefined1 local_a0 [32];
  storage_t<tinyusdz::Animatable<tinyusdz::Token>_> local_80 [8];
  optional<unsigned_int> oStack_78;
  undefined1 local_70 [64];
  
  local_518._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_518._M_impl.super__Rb_tree_header._M_header;
  local_518._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_518._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_518._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_570 = err;
  local_530 = warn;
  local_518._M_impl.super__Rb_tree_header._M_header._M_right =
       local_518._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._0_8_ = local_2b0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_518,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,CONCAT62(local_2b0._18_6_,local_2b0._16_2_) + 1);
  }
  local_5e8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4d0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar18 = local_5e8 == local_4d0;
  if (!bVar18) {
    local_4d8 = (Property *)&preader->fallback;
    local_528 = (Property *)&preader->varname;
    local_540 = &(preader->result)._metas;
    local_4e8 = (string *)&(preader->result)._actual_type_name;
    local_4e0 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
    local_538 = preader;
    do {
      local_448[0] = local_438;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_448,*(long *)(local_5e8 + 1),
                 (long)&(local_5e8[1]._M_parent)->_M_color + *(long *)(local_5e8 + 1));
      local_2b0._0_8_ = local_2b0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:fallback","");
      prop = (Property *)local_2b0;
      args_2 = local_4d8;
      local_568 = (Property *)(local_5e8 + 2);
      (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                ((ParseResult *)local_428,(_anonymous_namespace_ *)&local_518,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_448,(string *)(local_5e8 + 2),(Property *)local_2b0,(string *)local_4d8,
                 in_stack_fffffffffffffa08);
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,CONCAT62(local_2b0._18_6_,local_2b0._16_2_) + 1);
      }
      if (local_448[0] != local_438) {
        operator_delete(local_448[0],local_438[0] + 1);
      }
      iVar9 = 0;
      if (((ulong)local_428 & 0xfffffffd) == 0) {
        iVar9 = 3;
        bVar8 = false;
      }
      else {
        bVar8 = true;
        if (local_428._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x112a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          lVar3 = (long)&local_598 + 0x10;
          local_598._0_8_ = lVar3;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_598,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_5e0,(fmt *)&local_598,(string *)"inputs:fallback",
                     (char (*) [16])&local_420,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_5e0._0_8_,local_5e0._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
            operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
          }
          psVar5 = local_570;
          if (local_598._0_8_ != lVar3) {
            operator_delete((void *)local_598._0_8_,(ulong)(local_598.err._M_string_length + 1));
          }
          if (psVar5 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar12 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)&local_598,(ulong)(psVar5->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar1) {
              local_5e0._16_8_ = *psVar1;
              aStack_5c8._M_allocated_capacity = plVar12[3];
              local_5e0._0_8_ = local_5e0 + 0x10;
            }
            else {
              local_5e0._16_8_ = *psVar1;
              local_5e0._0_8_ = (size_type *)*plVar12;
            }
            local_5e0._8_8_ = plVar12[1];
            *plVar12 = (long)psVar1;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)psVar5,(string *)local_5e0);
            if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
              operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
            }
            if (local_598._0_8_ != lVar3) {
              operator_delete((void *)local_598._0_8_,(ulong)(local_598.err._M_string_length + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
          iVar9 = 1;
          bVar8 = false;
        }
      }
      pcVar17 = local_418 + 8;
      if (local_420._M_p != pcVar17) {
        operator_delete(local_420._M_p,local_418._8_8_ + 1);
      }
      if (bVar8) {
        local_520 = local_5e8 + 1;
        iVar9 = ::std::__cxx11::string::compare((char *)local_520);
        if (iVar9 == 0) {
          local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_468,"inputs:varname","");
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_518,&local_468);
          bVar8 = (_Rb_tree_header *)cVar14._M_node == &local_518._M_impl.super__Rb_tree_header;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar8 = false;
        }
        if (bVar8) {
          local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
          local_2b0._8_4_ = local_2b0._8_4_ & 0xffffff00;
          local_2b0._12_4_ = 0;
          local_2b0._16_2_ = 0;
          local_2b0[0x18] = '\0';
          local_238._24_8_ = (pointer)0x0;
          local_218 = false;
          local_178._120_8_ = 0;
          local_178._128_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_178._104_8_ = 0;
          local_178._112_8_ = 0;
          local_e8[0] = 0;
          local_e0._M_allocated_capacity = 0;
          asStack_268[0]._8_1_ = 0;
          local_2b0._64_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          asStack_268[0].dynamic = (void *)0x0;
          local_2b0._48_8_ = 0;
          local_2b0._56_8_ = 0;
          local_2b0._32_4_ = Varying;
          local_2b0[0x24] = false;
          local_2b0._37_3_ = 0;
          local_2b0._40_8_ = (pointer)0x0;
          local_238._16_1_ = 0;
          local_238.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_238._8_8_ = 0;
          local_248 = (pointer)0x0;
          pSStack_240 = (pointer)0x0;
          asStack_268[1]._0_8_ = (vtable_type *)0x0;
          asStack_268[1]._8_8_ = 0;
          local_1f0[0] = 0;
          local_210._16_8_ = 0;
          local_210._24_8_ = 0;
          local_210.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_210._8_1_ = false;
          local_210._9_3_ = 0;
          local_210._12_4_ = (storage_t<unsigned_int>)0x0;
          local_1f0[0x28] = 0;
          local_1f0._24_8_ = 0;
          local_1f0._32_8_ = 0;
          local_1f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1f0._16_8_ = 0;
          local_1c0.contained._24_1_ = 0;
          local_1c0.contained._8_8_ = 0;
          local_1c0.contained._16_8_ = 0;
          local_1c0.has_value_ = false;
          local_1c0._1_7_ = 0;
          local_1c0.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_178[0x10] = 0;
          local_178._0_8_ = 0;
          local_178._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_188 = (pointer)0x0;
          sStack_180 = (storage_t<double>)0x0;
          local_1c0.contained._32_8_ = 0;
          local_1c0.contained._40_8_ = 0;
          local_178[0x38] = '\0';
          local_178._40_8_ = (pointer)0x0;
          local_178._48_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_178._24_8_ = 0;
          local_178._32_8_ = 0;
          local_178[0x60] = 0;
          local_178._80_8_ = 0;
          local_178._88_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_178._64_8_ = 0;
          local_178._72_8_ = 0;
          local_e0._8_8_ = local_e8;
          sStack_c0._24_1_ = 0;
          sStack_c0._8_8_ = 0;
          sStack_c0._16_8_ = 0;
          local_c8 = 0;
          sStack_c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_a0[0x10] = 0;
          local_a0._17_8_ = 0;
          local_a0._0_8_ = (pointer)0x0;
          local_a0[8] = 0;
          local_a0._9_7_ = 0;
          local_70[0x30] = 0;
          local_70._49_8_ = 0;
          local_70._32_8_ = 0;
          local_70[0x28] = _S_red;
          local_70._41_7_ = 0;
          local_70._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_70._24_8_ = 0;
          local_70._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_70._8_8_ = 0;
          local_80[0] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[1] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[2] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[3] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[4] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[5] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[6] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          local_80[7] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
          oStack_78.has_value_ = false;
          oStack_78._1_3_ = 0;
          oStack_78.contained = (storage_t<unsigned_int>)0x0;
          local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
          local_d0 = local_e0._8_8_;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_488,*(long *)(local_5e8 + 1),
                     (long)&(local_5e8[1]._M_parent)->_M_color + *(long *)(local_5e8 + 1));
          prop = (Property *)local_428;
          local_428 = (undefined1  [8])local_418;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)prop,"inputs:varname","");
          args_2 = (Property *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    ((ParseResult *)local_5e0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_518,&local_488,local_568,(string *)prop,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
          if (local_428 != (undefined1  [8])local_418) {
            operator_delete((void *)local_428,(ulong)(local_418._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p != &local_488.field_2) {
            operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
          }
          if (local_5e0._0_4_ == TypeMismatch) {
            local_4a8[0] = local_498;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_4a8,*(long *)(local_5e8 + 1),
                       (long)&(local_5e8[1]._M_parent)->_M_color + *(long *)(local_5e8 + 1));
            prop = (Property *)local_428;
            local_428 = (undefined1  [8])local_418;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)prop,"inputs:varname","");
            args = local_568;
            args_2 = local_528;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      (&local_598,(_anonymous_namespace_ *)&local_518,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4a8,(string *)local_568,prop,(string *)local_528,
                       in_stack_fffffffffffffa08);
            if (local_428 != (undefined1  [8])local_418) {
              operator_delete((void *)local_428,(ulong)(local_418._0_8_ + 1));
            }
            psVar5 = local_570;
            if (local_4a8[0] != local_498) {
              operator_delete(local_4a8[0],local_498[0] + 1);
            }
            if (local_598.code == Success) {
              iVar9 = 3;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_428,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_428,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_428,0x1143);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_560,"Faied to parse inputs:varname: {}","");
              fmt::format<std::__cxx11::string>
                        (&local_5b8,(fmt *)&local_560,(string *)((long)&local_598 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_428,local_5b8._M_dataplus._M_p,
                                   local_5b8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                operator_delete(local_5b8._M_dataplus._M_p,
                                local_5b8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_560._M_dataplus._M_p != &local_560.field_2) {
                operator_delete(local_560._M_dataplus._M_p,
                                local_560.field_2._M_allocated_capacity + 1);
              }
              if (psVar5 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar12 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_560,(ulong)(psVar5->_M_dataplus)._M_p);
                psVar2 = (size_type *)(plVar12 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar2) {
                  local_5b8.field_2._M_allocated_capacity = *psVar2;
                  local_5b8.field_2._8_8_ = plVar12[3];
                  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
                }
                else {
                  local_5b8.field_2._M_allocated_capacity = *psVar2;
                  local_5b8._M_dataplus._M_p = (pointer)*plVar12;
                }
                local_5b8._M_string_length = plVar12[1];
                *plVar12 = (long)psVar2;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar5,(string *)&local_5b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                  operator_delete(local_5b8._M_dataplus._M_p,
                                  local_5b8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_560._M_dataplus._M_p != &local_560.field_2) {
                  operator_delete(local_560._M_dataplus._M_p,
                                  local_560.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
              ::std::ios_base::~ios_base(local_3b8);
              iVar9 = 1;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598.err._M_dataplus._M_p != &local_598.err.field_2) {
              operator_delete(local_598.err._M_dataplus._M_p,
                              local_598.err.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            iVar9 = 0;
            if (local_5e0._0_4_ == Success) {
              bVar8 = ConvertTokenAttributeToStringAttribute
                                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0
                                 ,(TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_528);
              iVar9 = 3;
              if (!bVar8) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_428,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_428,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_428,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,"():",3);
                poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_428,0x1131);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_428,
                           "Failed to convert inputs:varname token type to string type.",0x3b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,"\n",1);
                psVar5 = local_570;
                if (local_570 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar13 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_5b8,(ulong)(psVar5->_M_dataplus)._M_p)
                  ;
                  plVar12 = plVar13 + 2;
                  if ((long *)*plVar13 == plVar12) {
                    local_598.err._M_string_length = *plVar12;
                    local_598.err.field_2._M_allocated_capacity = plVar13[3];
                    local_598._0_8_ = (long)&local_598 + 0x10U;
                  }
                  else {
                    local_598.err._M_string_length = *plVar12;
                    local_598._0_8_ = (void *)*plVar13;
                  }
                  local_598.err._M_dataplus._M_p = (pointer)plVar13[1];
                  *plVar13 = (long)plVar12;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar5,(string *)&local_598);
                  if (local_598._0_8_ != (long)&local_598 + 0x10U) {
                    operator_delete((void *)local_598._0_8_,
                                    (ulong)(local_598.err._M_string_length + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                    operator_delete(local_5b8._M_dataplus._M_p,
                                    local_5b8.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
                ::std::ios_base::~ios_base(local_3b8);
                iVar9 = 1;
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e0._8_8_ != &aStack_5c8) {
            operator_delete((void *)local_5e0._8_8_,aStack_5c8._0_8_ + 1);
          }
          if (local_a0[0x18] == '\x01') {
            nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
            destruct_value(local_80);
          }
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
          AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
          if (iVar9 != 0) goto LAB_0023b996;
        }
        local_4c8 = local_4b8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4c8,*(long *)(local_5e8 + 1),
                   (long)&(local_5e8[1]._M_parent)->_M_color + *(long *)(local_5e8 + 1));
        local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"outputs:result","");
        uVar7 = local_4c0;
        sVar6 = local_560._M_string_length;
        local_418._0_8_ = (char *)0x0;
        local_418._8_8_ = local_418._8_8_ & 0xffffffffffffff00;
        __n = local_4c0;
        if (local_560._M_string_length < local_4c0) {
          __n = local_560._M_string_length;
        }
        local_420._M_p = pcVar17;
        if (__n == 0) {
          bVar8 = true;
        }
        else {
          iVar9 = bcmp(local_4c8,local_560._M_dataplus._M_p,__n);
          bVar8 = iVar9 == 0;
        }
        if ((bool)(bVar8 ^ 1U | uVar7 != sVar6)) {
          local_428._0_4_ = 1;
        }
        else {
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_518,&local_560);
          if ((_Rb_tree_header *)cVar14._M_node == &local_518._M_impl.super__Rb_tree_header) {
            if ((*(uint *)((long)&local_5e8[0x17]._M_parent + 4) < 2) &&
               (bVar8 = Attribute::is_connection(&local_568->_attrib), bVar8)) {
              local_428._0_4_ = 5;
              prop = (Property *)0x38;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_420,0,(char *)local_418._0_8_,0x3bef31);
            }
            else if (*(int *)((long)&local_5e8[0x17]._M_parent + 4) == 0) {
              Attribute::type_name_abi_cxx11_((string *)local_2b0,&local_568->_attrib);
              bVar8 = tinyusdz::value::IsRoleType((string *)local_2b0);
              local_5e0._0_8_ = local_5e0 + 0x10;
              local_5e0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x6;
              local_5e0._16_7_ = 0x676e69727473;
              if ((CONCAT44(local_2b0._12_4_,local_2b0._8_4_) == 6) &&
                 (*(short *)(local_2b0._0_8_ + 4) == 0x676e && *(int *)local_2b0._0_8_ == 0x69727473
                 )) {
                (local_538->result)._authored = true;
LAB_0023bbfe:
                AttrMetas::operator=(local_540,(AttrMetas *)(local_5e8 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_518,&local_560);
                local_428 = (undefined1  [8])((ulong)local_428 & 0xffffffff00000000);
              }
              else if (bVar8) {
                uVar10 = tinyusdz::value::GetUnderlyingTypeId((string *)local_2b0);
                if (uVar10 == 7) {
                  (local_538->result)._authored = true;
                  ::std::__cxx11::string::_M_assign(local_4e8);
                  goto LAB_0023bbfe;
                }
                local_428._0_4_ = 3;
                local_5b8._M_dataplus._M_p = (pointer)0x61;
                local_598._0_8_ = (long)&local_598 + 0x10U;
                pvVar16 = (void *)::std::__cxx11::string::_M_create
                                            ((ulong *)&local_598,(ulong)&local_5b8);
                _Var4._M_p = local_5b8._M_dataplus._M_p;
                local_598.err._M_string_length = (size_type)local_5b8._M_dataplus._M_p;
                local_598._0_8_ = pvVar16;
                memcpy(pvVar16,
                       "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                       ,0x61);
                local_598.err._M_dataplus._M_p = _Var4._M_p;
                *((long)pvVar16 + _Var4._M_p) = '\0';
                local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
                local_5b8._M_string_length = 6;
                local_5b8.field_2._M_allocated_capacity._0_7_ = 0x676e69727473;
                prop = (Property *)local_2b0;
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)local_5e0,(fmt *)&local_598,&local_560,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_5b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_2);
                ::std::__cxx11::string::operator=((string *)&local_420,(string *)local_5e0);
                if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
                  operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                  operator_delete(local_5b8._M_dataplus._M_p,
                                  local_5b8.field_2._M_allocated_capacity + 1);
                }
                if (local_598._0_8_ != (long)&local_598 + 0x10U) goto LAB_0023bbe0;
              }
              else {
                local_428._0_4_ = 3;
                local_5b8._M_dataplus._M_p = (pointer)0x46;
                local_598._0_8_ = (long)&local_598 + 0x10U;
                pvVar16 = (void *)::std::__cxx11::string::_M_create
                                            ((ulong *)&local_598,(ulong)&local_5b8);
                _Var4._M_p = local_5b8._M_dataplus._M_p;
                local_598.err._M_string_length = (size_type)local_5b8._M_dataplus._M_p;
                local_598._0_8_ = pvVar16;
                memcpy(pvVar16,
                       "Property type mismatch. {} expects type `{}` but defined as type `{}`.",0x46
                      );
                local_598.err._M_dataplus._M_p = _Var4._M_p;
                *((long)pvVar16 + _Var4._M_p) = '\0';
                local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
                local_5b8._M_string_length = 6;
                local_5b8.field_2._M_allocated_capacity._0_7_ = 0x676e69727473;
                prop = (Property *)local_2b0;
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)local_5e0,(fmt *)&local_598,&local_560,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_5b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_2);
                ::std::__cxx11::string::operator=((string *)&local_420,(string *)local_5e0);
                if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
                  operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                  operator_delete(local_5b8._M_dataplus._M_p,
                                  local_5b8.field_2._M_allocated_capacity + 1);
                }
                if (local_598._0_8_ != (long)&local_598 + 0x10U) {
LAB_0023bbe0:
                  operator_delete((void *)local_598._0_8_,
                                  (ulong)(local_598.err._M_string_length + 1));
                }
              }
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,
                                CONCAT62(local_2b0._18_6_,local_2b0._16_2_) + 1);
              }
            }
            else {
              prop = (Property *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_420,0,(char *)local_418._0_8_,0x3bef6a);
              local_428._0_4_ = 6;
            }
          }
          else {
            local_428._0_4_ = 2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
        }
        if (local_4c8 != local_4b8) {
          operator_delete(local_4c8,local_4b8[0] + 1);
        }
        iVar9 = 0;
        if (((ulong)local_428 & 0xfffffffd) == 0) {
          iVar9 = 3;
LAB_0023b533:
          bVar8 = false;
        }
        else {
          bVar8 = true;
          if (local_428._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x1149);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            lVar3 = (long)&local_598 + 0x10;
            local_598._0_8_ = lVar3;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_598,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5e0,(fmt *)&local_598,(string *)"outputs:result",
                       (char (*) [15])&local_420,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_5e0._0_8_,local_5e0._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
              operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
            }
            psVar5 = local_570;
            if (local_598._0_8_ != lVar3) {
              operator_delete((void *)local_598._0_8_,(ulong)(local_598.err._M_string_length + 1));
            }
            if (psVar5 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar12 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_598,(ulong)(psVar5->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar1) {
                local_5e0._16_8_ = *psVar1;
                aStack_5c8._M_allocated_capacity = plVar12[3];
                local_5e0._0_8_ = local_5e0 + 0x10;
              }
              else {
                local_5e0._16_8_ = *psVar1;
                local_5e0._0_8_ = (size_type *)*plVar12;
              }
              local_5e0._8_8_ = plVar12[1];
              *plVar12 = (long)psVar1;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar5,(string *)local_5e0);
              if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
                operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
              }
              if (local_598._0_8_ != lVar3) {
                operator_delete((void *)local_598._0_8_,(ulong)(local_598.err._M_string_length + 1))
                ;
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
            iVar9 = 1;
            goto LAB_0023b533;
          }
        }
        if (local_420._M_p != local_418 + 8) {
          operator_delete(local_420._M_p,local_418._8_8_ + 1);
        }
        __k = local_520;
        if (bVar8) {
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_518,(key_type *)local_520);
          if ((_Rb_tree_header *)cVar14._M_node == &local_518._M_impl.super__Rb_tree_header) {
            pmVar15 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::operator[](local_4e0,(key_type *)__k);
            ::std::__cxx11::string::_M_assign((string *)pmVar15);
            (pmVar15->_attrib)._varying_authored = (bool)local_5e8[3].field_0x4;
            (pmVar15->_attrib)._variability = local_5e8[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar15->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar15->_attrib)._var,(any *)&local_5e8[4]._M_parent);
            (pmVar15->_attrib)._var._blocked = SUB41(local_5e8[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&(pmVar15->_attrib)._var._ts,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&local_5e8[5]._M_parent);
            (pmVar15->_attrib)._var._ts._dirty = SUB41(local_5e8[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar15->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &local_5e8[6]._M_parent);
            AttrMetas::operator=(&(pmVar15->_attrib)._metas,(AttrMetas *)(local_5e8 + 7));
            *(_Base_ptr *)&pmVar15->_listOpQual = local_5e8[0x17]._M_parent;
            (pmVar15->_rel).type = *(Type *)&local_5e8[0x17]._M_left;
            Path::operator=(&(pmVar15->_rel).targetPath,(Path *)&local_5e8[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar15->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &local_5e8[0x1e]._M_parent);
            (pmVar15->_rel).listOpQual = local_5e8[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar15->_rel)._metas,(AttrMetas *)&local_5e8[0x1f]._M_parent);
            (pmVar15->_rel)._varying_authored = *(bool *)&local_5e8[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar15->_prop_value_type_name);
            __k = local_520;
            pmVar15->_has_custom = *(bool *)&local_5e8[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_518,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_520);
          }
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_518,(key_type *)__k);
          iVar9 = 0;
          if ((_Rb_tree_header *)cVar14._M_node == &local_518._M_impl.super__Rb_tree_header) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x114b);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_428,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __k);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_428,(long)local_420._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if (local_428 != (undefined1  [8])local_418) {
              operator_delete((void *)local_428,(ulong)(local_418._0_8_ + 1));
            }
            if (local_530 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar13 = (long *)::std::__cxx11::string::_M_append
                                          (local_5e0,(ulong)(local_570->_M_dataplus)._M_p);
              plVar12 = plVar13 + 2;
              if ((long *)*plVar13 == plVar12) {
                local_418._0_8_ = *plVar12;
                local_418._8_8_ = plVar13[3];
                local_428 = (undefined1  [8])local_418;
              }
              else {
                local_418._0_8_ = *plVar12;
                local_428 = (undefined1  [8])*plVar13;
              }
              local_420._M_p = (pointer)plVar13[1];
              *plVar13 = (long)plVar12;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_530,(string *)local_428);
              if (local_428 != (undefined1  [8])local_418) {
                operator_delete((void *)local_428,(ulong)(local_418._0_8_ + 1));
              }
              if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
                operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)&pSStack_240);
          }
        }
      }
LAB_0023b996:
      if ((iVar9 != 3) && (iVar9 != 0)) break;
      local_5e8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_5e8);
      bVar18 = local_5e8 == local_4d0;
    } while (!bVar18);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_518,(_Link_type)local_518._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar18;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_string>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_string *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_string,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_string, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_string, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}